

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm_suite.cpp
# Opt level: O0

void pop_sorted_suite::pop_increasing(void)

{
  iterator pvVar1;
  iterator pvVar2;
  iterator pvVar3;
  iterator pvVar4;
  iterator pvVar5;
  undefined1 local_60 [8];
  array<int,_4UL> expect_3;
  array<int,_4UL> expect_2;
  array<int,_4UL> expect_1;
  array<int,_4UL> expect;
  iterator last;
  array<int,_4UL> storage;
  
  last = (iterator)0x160000000b;
  storage._M_elems[0] = 0x21;
  storage._M_elems[1] = 0x2c;
  pvVar1 = std::array<int,_4UL>::end((array<int,_4UL> *)&last);
  pvVar2 = std::array<int,_4UL>::begin((array<int,_4UL> *)&last);
  vista::pop_sorted<int*>(pvVar2,pvVar1);
  expect_1._M_elems[2] = 0x16;
  expect_1._M_elems[3] = 0x21;
  pvVar2 = std::array<int,_4UL>::begin((array<int,_4UL> *)&last);
  pvVar3 = std::array<int,_4UL>::end((array<int,_4UL> *)&last);
  pvVar4 = std::array<int,_4UL>::begin((array<int,_4UL> *)(expect_1._M_elems + 2));
  pvVar5 = std::array<int,_4UL>::end((array<int,_4UL> *)(expect_1._M_elems + 2));
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x51e,"void pop_sorted_suite::pop_increasing()",pvVar2,pvVar3,pvVar4,pvVar5);
  pvVar2 = std::array<int,_4UL>::begin((array<int,_4UL> *)&last);
  vista::pop_sorted<int*>(pvVar2,pvVar1 + -1);
  expect_2._M_elems[2] = 0x21;
  expect_2._M_elems[3] = 0x2c;
  expect_1._M_elems[0] = 0x16;
  expect_1._M_elems[1] = 0xb;
  pvVar2 = std::array<int,_4UL>::begin((array<int,_4UL> *)&last);
  pvVar3 = std::array<int,_4UL>::end((array<int,_4UL> *)&last);
  pvVar4 = std::array<int,_4UL>::begin((array<int,_4UL> *)(expect_2._M_elems + 2));
  pvVar5 = std::array<int,_4UL>::end((array<int,_4UL> *)(expect_2._M_elems + 2));
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x525,"void pop_sorted_suite::pop_increasing()",pvVar2,pvVar3,pvVar4,pvVar5);
  pvVar2 = std::array<int,_4UL>::begin((array<int,_4UL> *)&last);
  vista::pop_sorted<int*>(pvVar2,pvVar1 + -2);
  expect_3._M_elems[2] = 0x2c;
  expect_3._M_elems[3] = 0x21;
  expect_2._M_elems[0] = 0x16;
  expect_2._M_elems[1] = 0xb;
  pvVar2 = std::array<int,_4UL>::begin((array<int,_4UL> *)&last);
  pvVar3 = std::array<int,_4UL>::end((array<int,_4UL> *)&last);
  pvVar4 = std::array<int,_4UL>::begin((array<int,_4UL> *)(expect_3._M_elems + 2));
  pvVar5 = std::array<int,_4UL>::end((array<int,_4UL> *)(expect_3._M_elems + 2));
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x52c,"void pop_sorted_suite::pop_increasing()",pvVar2,pvVar3,pvVar4,pvVar5);
  pvVar2 = std::array<int,_4UL>::begin((array<int,_4UL> *)&last);
  vista::pop_sorted<int*>(pvVar2,pvVar1 + -3);
  local_60._0_4_ = 0x2c;
  local_60._4_4_ = 0x21;
  expect_3._M_elems[0] = 0x16;
  expect_3._M_elems[1] = 0xb;
  pvVar1 = std::array<int,_4UL>::begin((array<int,_4UL> *)&last);
  pvVar2 = std::array<int,_4UL>::end((array<int,_4UL> *)&last);
  pvVar3 = std::array<int,_4UL>::begin((array<int,_4UL> *)local_60);
  pvVar4 = std::array<int,_4UL>::end((array<int,_4UL> *)local_60);
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x533,"void pop_sorted_suite::pop_increasing()",pvVar1,pvVar2,pvVar3,pvVar4);
  return;
}

Assistant:

void pop_increasing()
{
    std::array<int, 4> storage = { 11, 22, 33, 44 };
    auto last = storage.end();
    pop_sorted(storage.begin(), last);
    {
        std::array<int, 4> expect = { 22, 33, 44, 11 };
        BOOST_TEST_ALL_EQ(storage.begin(), storage.end(),
                          expect.begin(), expect.end());
    }
    --last;
    pop_sorted(storage.begin(), last);
    {
        std::array<int, 4> expect = { 33, 44, 22, 11 };
        BOOST_TEST_ALL_EQ(storage.begin(), storage.end(),
                          expect.begin(), expect.end());
    }
    --last;
    pop_sorted(storage.begin(), last);
    {
        std::array<int, 4> expect = { 44, 33, 22, 11 };
        BOOST_TEST_ALL_EQ(storage.begin(), storage.end(),
                          expect.begin(), expect.end());
    }
    --last;
    pop_sorted(storage.begin(), last);
    {
        std::array<int, 4> expect = { 44, 33, 22, 11 };
        BOOST_TEST_ALL_EQ(storage.begin(), storage.end(),
                          expect.begin(), expect.end());
    }
}